

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  byte *pbVar1;
  cJSON *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  cJSON *pcVar9;
  cJSON *pcVar10;
  cJSON *pcVar11;
  
  pcVar10 = (cJSON *)(*cJSON_malloc)(0x40);
  if (pcVar10 == (cJSON *)0x0) {
    pcVar10 = (cJSON *)0x0;
  }
  else {
    pcVar10->valuedouble = 0.0;
    pcVar10->string = (char *)0x0;
    pcVar10->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar10->valueint = 0;
    pcVar10->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar10->type = 0;
    pcVar10->next = (cJSON *)0x0;
    pcVar10->prev = (cJSON *)0x0;
    pcVar9 = item->next;
    pcVar11 = item->prev;
    pcVar2 = item->child;
    iVar5 = item->type;
    uVar6 = *(undefined4 *)&item->field_0x1c;
    pcVar3 = item->valuestring;
    iVar7 = item->valueint;
    uVar8 = *(undefined4 *)&item->field_0x2c;
    pcVar4 = item->string;
    pcVar10->valuedouble = item->valuedouble;
    pcVar10->string = pcVar4;
    pcVar10->child = pcVar2;
    pcVar10->type = iVar5;
    *(undefined4 *)&pcVar10->field_0x1c = uVar6;
    pcVar10->next = pcVar9;
    pcVar10->prev = pcVar11;
    pcVar10->valuestring = pcVar3;
    pcVar10->valueint = iVar7;
    *(undefined4 *)&pcVar10->field_0x2c = uVar8;
    pcVar10->string = (char *)0x0;
    pbVar1 = (byte *)((long)&pcVar10->type + 1);
    *pbVar1 = *pbVar1 | 1;
    pcVar10->next = (cJSON *)0x0;
    pcVar10->prev = (cJSON *)0x0;
  }
  if (pcVar10 != (cJSON *)0x0) {
    pcVar9 = array->child;
    if (array->child == (cJSON *)0x0) {
      array->child = pcVar10;
    }
    else {
      do {
        pcVar11 = pcVar9;
        pcVar9 = pcVar11->next;
      } while (pcVar11->next != (cJSON *)0x0);
      pcVar11->next = pcVar10;
      pcVar10->prev = pcVar11;
    }
  }
  return;
}

Assistant:

void	cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)						{cJSON_AddItemToArray(array,create_reference(item));}